

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

void JS_AddIntrinsicPromise(JSContext *ctx)

{
  JSRuntime *rt;
  JSClass *pJVar1;
  JSValue *pJVar2;
  JSRefCountHeader *p;
  JSValue JVar3;
  
  rt = ctx->rt;
  if (((uint)rt->class_count < 0x2b) || (rt->class_array[0x2a].class_id == 0)) {
    init_class_range(rt,js_async_class_def,0x2a,9);
    pJVar1 = rt->class_array;
    pJVar1[0x2b].call = js_promise_resolve_function_call;
    pJVar1[0x2c].call = js_promise_resolve_function_call;
    pJVar1[0x2d].call = js_async_function_call;
    pJVar1[0x2e].call = js_async_function_resolve_call;
    pJVar1[0x2f].call = js_async_function_resolve_call;
    pJVar1[0x31].call = js_async_generator_function_call;
  }
  pJVar2 = ctx->class_proto;
  JVar3 = JS_NewObject(ctx);
  pJVar2[0x2a] = JVar3;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x2a],js_promise_proto_funcs,4);
  JVar3 = JS_NewCFunction2(ctx,js_promise_constructor,"Promise",1,JS_CFUNC_constructor,0);
  if (0xfffffff4 < (uint)JVar3.tag) {
    *(int *)JVar3.u.ptr = *JVar3.u.ptr + 1;
  }
  ctx->promise_ctor = JVar3;
  JS_SetPropertyFunctionList(ctx,JVar3,js_promise_funcs,7);
  JS_NewGlobalCConstructor2(ctx,JVar3,"Promise",ctx->class_proto[0x2a]);
  pJVar2 = ctx->class_proto;
  JVar3 = JS_NewObjectProto(ctx,ctx->function_proto);
  pJVar2[0x2d] = JVar3;
  JVar3 = JS_NewCFunction3(ctx,js_function_constructor,"AsyncFunction",1,
                           JS_CFUNC_constructor_or_func_magic,2,ctx->function_ctor);
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x2d],js_async_function_proto_funcs,1);
  JS_SetConstructor2(ctx,JVar3,ctx->class_proto[0x2d],0,1);
  JS_FreeValue(ctx,JVar3);
  JVar3 = JS_NewObject(ctx);
  ctx->async_iterator_proto = JVar3;
  JS_SetPropertyFunctionList(ctx,JVar3,js_async_iterator_proto_funcs,1);
  pJVar2 = ctx->class_proto;
  JVar3 = JS_NewObjectProto(ctx,ctx->async_iterator_proto);
  pJVar2[0x30] = JVar3;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x30],js_async_from_sync_iterator_proto_funcs,3);
  pJVar2 = ctx->class_proto;
  JVar3 = JS_NewObjectProto(ctx,ctx->async_iterator_proto);
  pJVar2[0x32] = JVar3;
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x32],js_async_generator_proto_funcs,4);
  pJVar2 = ctx->class_proto;
  JVar3 = JS_NewObjectProto(ctx,ctx->function_proto);
  pJVar2[0x31] = JVar3;
  JVar3 = JS_NewCFunction3(ctx,js_function_constructor,"AsyncGeneratorFunction",1,
                           JS_CFUNC_constructor_or_func_magic,3,ctx->function_ctor);
  JS_SetPropertyFunctionList(ctx,ctx->class_proto[0x31],js_async_generator_function_proto_funcs,1);
  JS_SetConstructor2(ctx,ctx->class_proto[0x31],ctx->class_proto[0x32],1,1);
  JS_SetConstructor2(ctx,JVar3,ctx->class_proto[0x31],0,1);
  JS_FreeValue(ctx,JVar3);
  return;
}

Assistant:

void JS_AddIntrinsicPromise(JSContext *ctx)
{
    JSRuntime *rt = ctx->rt;
    JSValue obj1;

    if (!JS_IsRegisteredClass(rt, JS_CLASS_PROMISE)) {
        init_class_range(rt, js_async_class_def, JS_CLASS_PROMISE,
                         countof(js_async_class_def));
        rt->class_array[JS_CLASS_PROMISE_RESOLVE_FUNCTION].call = js_promise_resolve_function_call;
        rt->class_array[JS_CLASS_PROMISE_REJECT_FUNCTION].call = js_promise_resolve_function_call;
        rt->class_array[JS_CLASS_ASYNC_FUNCTION].call = js_async_function_call;
        rt->class_array[JS_CLASS_ASYNC_FUNCTION_RESOLVE].call = js_async_function_resolve_call;
        rt->class_array[JS_CLASS_ASYNC_FUNCTION_REJECT].call = js_async_function_resolve_call;
        rt->class_array[JS_CLASS_ASYNC_GENERATOR_FUNCTION].call = js_async_generator_function_call;
    }

    /* Promise */
    ctx->class_proto[JS_CLASS_PROMISE] = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_PROMISE],
                               js_promise_proto_funcs,
                               countof(js_promise_proto_funcs));
    obj1 = JS_NewCFunction2(ctx, js_promise_constructor, "Promise", 1,
                            JS_CFUNC_constructor, 0);
    ctx->promise_ctor = JS_DupValue(ctx, obj1);
    JS_SetPropertyFunctionList(ctx, obj1,
                               js_promise_funcs,
                               countof(js_promise_funcs));
    JS_NewGlobalCConstructor2(ctx, obj1, "Promise",
                              ctx->class_proto[JS_CLASS_PROMISE]);

    /* AsyncFunction */
    ctx->class_proto[JS_CLASS_ASYNC_FUNCTION] = JS_NewObjectProto(ctx, ctx->function_proto);
    obj1 = JS_NewCFunction3(ctx, (JSCFunction *)js_function_constructor,
                            "AsyncFunction", 1,
                            JS_CFUNC_constructor_or_func_magic, JS_FUNC_ASYNC,
                            ctx->function_ctor);
    JS_SetPropertyFunctionList(ctx,
                               ctx->class_proto[JS_CLASS_ASYNC_FUNCTION],
                               js_async_function_proto_funcs,
                               countof(js_async_function_proto_funcs));
    JS_SetConstructor2(ctx, obj1, ctx->class_proto[JS_CLASS_ASYNC_FUNCTION],
                       0, JS_PROP_CONFIGURABLE);
    JS_FreeValue(ctx, obj1);

    /* AsyncIteratorPrototype */
    ctx->async_iterator_proto = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->async_iterator_proto,
                               js_async_iterator_proto_funcs,
                               countof(js_async_iterator_proto_funcs));

    /* AsyncFromSyncIteratorPrototype */
    ctx->class_proto[JS_CLASS_ASYNC_FROM_SYNC_ITERATOR] =
        JS_NewObjectProto(ctx, ctx->async_iterator_proto);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_ASYNC_FROM_SYNC_ITERATOR],
                               js_async_from_sync_iterator_proto_funcs,
                               countof(js_async_from_sync_iterator_proto_funcs));

    /* AsyncGeneratorPrototype */
    ctx->class_proto[JS_CLASS_ASYNC_GENERATOR] =
        JS_NewObjectProto(ctx, ctx->async_iterator_proto);
    JS_SetPropertyFunctionList(ctx,
                               ctx->class_proto[JS_CLASS_ASYNC_GENERATOR],
                               js_async_generator_proto_funcs,
                               countof(js_async_generator_proto_funcs));

    /* AsyncGeneratorFunction */
    ctx->class_proto[JS_CLASS_ASYNC_GENERATOR_FUNCTION] =
        JS_NewObjectProto(ctx, ctx->function_proto);
    obj1 = JS_NewCFunction3(ctx, (JSCFunction *)js_function_constructor,
                            "AsyncGeneratorFunction", 1,
                            JS_CFUNC_constructor_or_func_magic,
                            JS_FUNC_ASYNC_GENERATOR,
                            ctx->function_ctor);
    JS_SetPropertyFunctionList(ctx,
                               ctx->class_proto[JS_CLASS_ASYNC_GENERATOR_FUNCTION],
                               js_async_generator_function_proto_funcs,
                               countof(js_async_generator_function_proto_funcs));
    JS_SetConstructor2(ctx, ctx->class_proto[JS_CLASS_ASYNC_GENERATOR_FUNCTION],
                       ctx->class_proto[JS_CLASS_ASYNC_GENERATOR],
                       JS_PROP_CONFIGURABLE, JS_PROP_CONFIGURABLE);
    JS_SetConstructor2(ctx, obj1, ctx->class_proto[JS_CLASS_ASYNC_GENERATOR_FUNCTION],
                       0, JS_PROP_CONFIGURABLE);
    JS_FreeValue(ctx, obj1);
}